

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O0

int prvTidySaveConfigFile(TidyDocImpl *doc,ctmbstr cfgfil)

{
  ulong uVar1;
  ulong uVar2;
  FILE *__stream;
  StreamOut *out_00;
  FILE *fout;
  uint nl;
  uint outenc;
  StreamOut *out;
  int status;
  ctmbstr cfgfil_local;
  TidyDocImpl *doc_local;
  
  out._4_4_ = -1;
  uVar1 = (doc->config).value[0x3c].v;
  uVar2 = (doc->config).value[0x39].v;
  __stream = fopen(cfgfil,"wb");
  if (__stream != (FILE *)0x0) {
    out_00 = prvTidyFileOutput(doc,(FILE *)__stream,(int)uVar1,(uint)uVar2);
    out._4_4_ = SaveConfigToStream(doc,out_00);
    fclose(__stream);
    (*doc->allocator->vtbl->free)(doc->allocator,out_00);
  }
  return out._4_4_;
}

Assistant:

int  TY_(SaveConfigFile)( TidyDocImpl* doc, ctmbstr cfgfil )
{
    int status = -1;
    StreamOut* out = NULL;
    uint outenc = cfg( doc, TidyOutCharEncoding );
    uint nl = cfg( doc, TidyNewline );
    FILE* fout = fopen( cfgfil, "wb" );
    if ( fout )
    {
        out = TY_(FileOutput)( doc, fout, outenc, nl );
        status = SaveConfigToStream( doc, out );
        fclose( fout );
        TidyDocFree( doc, out );
    }
    return status;
}